

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JsonReporter::listListeners
          (JsonReporter *this,
          vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
          *descriptions)

{
  bool bVar1;
  reference this_00;
  size_type __n;
  undefined8 in_RSI;
  JsonValueWriter *in_RDI;
  StringRef SVar2;
  JsonObjectWriter desc_writer;
  ListenerDescription *desc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *__range1;
  JsonArrayWriter writer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  JsonReporter *in_stack_fffffffffffffa80;
  size_t local_578;
  JsonObjectWriter local_570 [17];
  char *local_3d8;
  void *pvStack_3d0;
  StringRef local_3c0;
  JsonValueWriter local_3b0;
  undefined1 local_218 [24];
  reference local_200;
  ListenerDescription *local_1f8;
  __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
  local_1f0;
  undefined8 local_1e8;
  StringRef local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0 [13];
  undefined8 local_10;
  
  local_10 = in_RSI;
  startListing(in_stack_fffffffffffffa80);
  this_00 = std::
            stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
            ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                   *)0x1a54f8);
  local_1d0 = operator____sr((char *)this_00,(size_t)in_RDI);
  value = local_1c0;
  JsonObjectWriter::write((JsonObjectWriter *)value,(int)this_00,local_1d0.m_start,local_1d0.m_size)
  ;
  JsonValueWriter::writeArray(in_RDI);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a5566);
  local_1e8 = local_10;
  local_1f0._M_current =
       (ListenerDescription *)
       std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::begin
                 ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *
                  )in_RDI);
  local_1f8 = (ListenerDescription *)
              std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
              end((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *
                  )in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
                        *)this_00,
                       (__normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    local_200 = __gnu_cxx::
                __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
                ::operator*(&local_1f0);
    JsonArrayWriter::writeObject((JsonArrayWriter *)value);
    local_3c0 = operator____sr((char *)this_00,(size_t)in_RDI);
    __n = local_3c0.m_size;
    JsonObjectWriter::write
              ((JsonObjectWriter *)&local_3b0,(int)local_218,local_3c0.m_start,local_3c0.m_size);
    local_3d8 = (local_200->name).m_start;
    pvStack_3d0 = (void *)(local_200->name).m_size;
    JsonValueWriter::write(&local_3b0,(int)local_3d8,pvStack_3d0,__n);
    JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a5671);
    SVar2 = operator____sr((char *)this_00,(size_t)in_RDI);
    local_578 = SVar2.m_size;
    JsonObjectWriter::write(local_570,(int)local_218,(JsonValueWriter *)SVar2.m_start,local_578);
    JsonValueWriter::write<std::__cxx11::string>((JsonValueWriter *)SVar2.m_start,value);
    JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a56cc);
    JsonObjectWriter::~JsonObjectWriter(this_00);
    __gnu_cxx::
    __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
    ::operator++(&local_1f0);
  }
  JsonArrayWriter::~JsonArrayWriter((JsonArrayWriter *)this_00);
  return;
}

Assistant:

void JsonReporter::listListeners(
        std::vector<ListenerDescription> const& descriptions ) {
        startListing();

        auto writer =
            m_objectWriters.top().write( "listeners"_sr ).writeArray();

        for ( auto const& desc : descriptions ) {
            auto desc_writer = writer.writeObject();
            desc_writer.write( "name"_sr ).write( desc.name );
            desc_writer.write( "description"_sr ).write( desc.description );
        }
    }